

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeValves(ProjectWriter *this)

{
  double dVar1;
  Link *pLVar2;
  bool bVar3;
  int iVar4;
  _Setw _Var5;
  _Setprecision _Var6;
  vector<Link_*,_std::allocator<Link_*>_> *this_00;
  reference ppLVar7;
  ostream *poVar8;
  Curve *pCVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double cf;
  Valve *valve;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[VALVES]\n");
  this_00 = &this->network->links;
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(this_00);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                     *)&link), bVar3) {
    ppLVar7 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    pLVar2 = *ppLVar7;
    iVar4 = (*(pLVar2->super_Element)._vptr_Element[2])();
    if (iVar4 == 2) {
      poVar8 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<(poVar8,_Var5);
      poVar8 = std::operator<<(poVar8,(string *)&(pLVar2->super_Element).name);
      std::operator<<(poVar8," ");
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      std::operator<<(poVar8,(string *)&(pLVar2->fromNode->super_Element).name);
      _Var5 = std::setw(0x10);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      std::operator<<(poVar8,(string *)&(pLVar2->toNode->super_Element).name);
      poVar8 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::fixed);
      _Var6 = std::setprecision(4);
      std::operator<<(poVar8,_Var6);
      _Var5 = std::setw(0xc);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      dVar1 = pLVar2->diameter;
      dVar10 = Network::ucf(this->network,DIAMETER);
      std::ostream::operator<<(poVar8,dVar1 * dVar10);
      _Var5 = std::setw(8);
      poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
      std::operator<<(poVar8,Valve::ValveTypeWords[*(int *)&pLVar2[1].super_Element._vptr_Element]);
      if (*(int *)&pLVar2[1].super_Element._vptr_Element == 5) {
        _Var5 = std::setw(0x10);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        pCVar9 = Network::curve(this->network,(int)pLVar2->initSetting);
        poVar8 = std::operator<<(poVar8,(string *)&(pCVar9->super_Element).name);
        std::operator<<(poVar8,"\n");
      }
      else {
        dVar1 = pLVar2->initSetting;
        (*(pLVar2->super_Element)._vptr_Element[5])(pLVar2->initSetting,pLVar2,this->network);
        _Var5 = std::setw(0xc);
        poVar8 = std::operator<<((ostream *)&this->field_0x18,_Var5);
        poVar8 = (ostream *)
                 std::ostream::operator<<(poVar8,(dVar1 / extraout_XMM0_Qa) * pLVar2->initSetting);
        std::operator<<(poVar8,"\n");
      }
    }
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeValves()
{
    fout << "\n[VALVES]\n";
    for (Link* link : network->links)
    {
        if ( link->type() == Link::VALVE )
        {
            Valve* valve = static_cast<Valve*>(link);
            fout << left << setw(16) << link->name << " ";
            fout << setw(16) << link->fromNode->name;
            fout << setw(16) << link->toNode->name;
            fout << fixed << setprecision(4);
            fout << setw(12) << valve->diameter*network->ucf(Units::DIAMETER);
            fout << setw(8) << Valve::ValveTypeWords[(int)valve->valveType];

            if (valve->valveType == Valve::GPV)
            {
                fout << setw(16) << network->curve((int)link->initSetting)->name << "\n";
            }
            else
            {
                double cf = link->initSetting /
                            link->convertSetting(network, link->initSetting);
                fout << setw(12) << cf * link->initSetting << "\n";
            }
        }
    }
}